

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_binding.hpp
# Opt level: O3

any * shadow::conversion_detail::generic_conversion_bind_point<float,unsigned_long_long>(any *src)

{
  _func_int **pp_Var1;
  holder_base *phVar2;
  any *in_RDI;
  
  phVar2 = (holder_base *)((long)&src->field_1 + 8);
  if (src->on_heap_ != false) {
    phVar2 = (src->field_1).heap + 1;
  }
  pp_Var1 = phVar2->_vptr_holder_base;
  in_RDI->on_heap_ = false;
  (in_RDI->field_1).heap = (holder_base *)&PTR_copy_0012eaa8;
  *(float *)((long)&in_RDI->field_1 + 8) = (float)pp_Var1;
  return in_RDI;
}

Assistant:

any
generic_conversion_bind_point(const any& src)
{
    return conversion_specializer<TargetType, SourceType>::dispatch(src);
}